

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O1

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::enqueue
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *clients,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *client,milliseconds collect_time)

{
  _Atomic_word *p_Var1;
  int iVar2;
  size_t sVar3;
  io_context_pool *piVar4;
  milliseconds sleep_time;
  bool bVar5;
  type local_39;
  undefined1 local_38 [32];
  
  sVar3 = detail::
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          ::enqueue(clients,client);
  if (sVar3 == 1) {
    LOCK();
    bVar5 = (clients->collecter_cnt_).super___atomic_base<unsigned_long>._M_i == 0;
    if (bVar5) {
      (clients->collecter_cnt_).super___atomic_base<unsigned_long>._M_i = 1;
    }
    UNLOCK();
    if (bVar5) {
      local_38._16_8_ =
           (this->
           super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
           )._M_weak_this.
           super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_38._24_8_ =
           (this->
           super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
           )._M_weak_this.
           super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_weak_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_weak_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_weak_count + 1;
        }
      }
      sleep_time.__r = 0x32;
      if (0x32 < collect_time.__r) {
        sleep_time.__r = collect_time.__r;
      }
      collect_idle_timeout_client
                ((client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *)local_38,
                 (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)(local_38 + 0x10),clients,sleep_time,
                 (ulong)(this->pool_config_).idle_queue_per_max_clear_count);
      std::thread::hardware_concurrency();
      piVar4 = g_io_context_pool<coro_io::io_context_pool>(0);
      LOCK();
      (piVar4->next_io_context_).super___atomic_base<unsigned_long>._M_i =
           (piVar4->next_io_context_).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      async_simple::coro::Lazy<void>::via((Lazy<void> *)(local_38 + 8),(Executor *)local_38);
      async_simple::coro::detail::LazyBase<void,_true>::
      start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_client_pool_hpp:262:20)>
                ((LazyBase<void,_true> *)(local_38 + 8),&local_39);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (**(code **)(local_38._8_8_ + 8))();
        local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((element_type *)local_38._0_8_ != (element_type *)0x0) {
        (*(code *)(((enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                     *)local_38._0_8_)->_M_weak_this).
                  super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)();
        local_38._0_8_ = (element_type *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_38._24_8_ + 0xc);
          iVar2 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar2 = *(_Atomic_word *)(local_38._24_8_ + 0xc);
          *(int *)(local_38._24_8_ + 0xc) = iVar2 + -1;
        }
        if (iVar2 == 1) {
          (**(code **)(*(long *)local_38._24_8_ + 0x18))();
        }
      }
    }
  }
  return;
}

Assistant:

void enqueue(
      coro_io::detail::client_queue<std::unique_ptr<client_t>>& clients,
      std::unique_ptr<client_t> client,
      std::chrono::milliseconds collect_time) {
    if (clients.enqueue(std::move(client)) == 1) {
      std::size_t expected = 0;
      if (clients.collecter_cnt_.compare_exchange_strong(expected, 1)) {
        CINATRA_LOG_TRACE << "start timeout client collecter of client_pool{"
                          << host_name_ << "}";
        collect_idle_timeout_client(
            this->weak_from_this(), clients,
            (std::max)(collect_time, std::chrono::milliseconds{50}),
            pool_config_.idle_queue_per_max_clear_count)
            .via(coro_io::get_global_executor())
            .start([](auto&&) {
            });
      }
    }
  }